

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

void Gla_ManExplorePPis(Gla_Man_t *p,Vec_Int_t *vPPis)

{
  Gla_Obj_t *pObj_00;
  Gla_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  int local_38;
  int local_34;
  int Count;
  int k;
  int j;
  int i;
  Gla_Obj_t *pFanin;
  Gla_Obj_t *pObj;
  Vec_Int_t *vPPis_local;
  Gla_Man_t *p_local;
  
  iVar2 = Gla_ManExplorePPis::Round + 1;
  iVar3 = Gla_ManExplorePPis::Round % 5;
  Gla_ManExplorePPis::Round = iVar2;
  if (iVar3 != 0) {
    Count = 0;
    for (k = 0; iVar2 = Vec_IntSize(vPPis), k < iVar2; k = k + 1) {
      iVar2 = Vec_IntEntry(vPPis,k);
      pObj_00 = Gla_ManObj(p,iVar2);
      if ((*(uint *)&pObj_00->field_0x4 & 1) != 0) {
        __assert_fail("pObj->fAbs == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x4fa,"void Gla_ManExplorePPis(Gla_Man_t *, Vec_Int_t *)");
      }
      local_38 = 0;
      for (local_34 = 0; local_34 < (int)(*(uint *)&pObj_00->field_0x4 >> 9);
          local_34 = local_34 + 1) {
        pGVar1 = Gla_ManObj(p,pObj_00->Fanins[local_34]);
        local_38 = (*(uint *)&pGVar1->field_0x4 & 1) + local_38;
      }
      if ((local_38 != 0) && (((Gla_ManExplorePPis::Round & 1U) == 0 || (local_38 != 1)))) {
        iVar2 = Gla_ObjId(p,pObj_00);
        Vec_IntWriteEntry(vPPis,Count,iVar2);
        Count = Count + 1;
      }
    }
    Vec_IntShrink(vPPis,Count);
  }
  return;
}

Assistant:

void Gla_ManExplorePPis( Gla_Man_t * p, Vec_Int_t * vPPis )
{
    static int Round = 0;
    Gla_Obj_t * pObj, * pFanin;
    int i, j, k, Count;
    if ( (Round++ % 5) == 0 )
        return;
    j = 0;
    Gla_ManForEachObjAbsVec( vPPis, p, pObj, i )
    {
        assert( pObj->fAbs == 0 );
        Count = 0;
        Gla_ObjForEachFanin( p, pObj, pFanin, k )
            Count += pFanin->fAbs;
        if ( Count == 0 || ((Round & 1) && Count == 1) )
            continue;
        Vec_IntWriteEntry( vPPis, j++, Gla_ObjId(p, pObj) );
    }
//    printf( "\n%d -> %d\n", Vec_IntSize(vPPis), j );
    Vec_IntShrink( vPPis, j );
}